

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chimp_scan.hpp
# Opt level: O3

void __thiscall
duckdb::ChimpScanState<float>::LoadGroup(ChimpScanState<float> *this,CHIMP_TYPE *value_buffer)

{
  ChimpGroupState<unsigned_int> *this_00;
  byte bVar1;
  data_ptr_t pdVar2;
  idx_t iVar3;
  long lVar4;
  idx_t iVar5;
  idx_t packed_data_block_count;
  uint8_t *packed_data;
  uint16_t *packed_data_00;
  idx_t count;
  
  pdVar2 = this->metadata_ptr;
  this->metadata_ptr = pdVar2 + -5;
  bVar1 = pdVar2[-5];
  count = this->segment_count - this->total_value_count;
  if (0x3ff < count) {
    count = 0x400;
  }
  packed_data = pdVar2 + (ulong)bVar1 * -3 + -5;
  this->metadata_ptr = packed_data + -(ulong)((int)count + 2U >> 2);
  this_00 = &this->group_state;
  ChimpGroupState<unsigned_int>::LoadFlags
            (this_00,packed_data + -(ulong)((int)count + 2U >> 2),count - 1);
  ChimpGroupState<unsigned_int>::LoadLeadingZeros(this_00,packed_data,(ulong)bVar1 << 3);
  iVar3 = (this->group_state).max_flags_to_read;
  if (iVar3 == 0) {
    packed_data_block_count = 0;
  }
  else {
    iVar5 = 0;
    packed_data_block_count = 0;
    do {
      lVar4 = iVar5 + 1;
      iVar5 = iVar5 + 1;
      packed_data_block_count =
           packed_data_block_count +
           ((this->group_state).flags[lVar4] == TRAILING_EXCEEDS_THRESHOLD);
    } while (iVar3 != iVar5);
  }
  packed_data_00 =
       (uint16_t *)((ulong)(this->metadata_ptr + packed_data_block_count * -2) & 0xfffffffffffffffe)
  ;
  this->metadata_ptr = (data_ptr_t)packed_data_00;
  ChimpGroupState<unsigned_int>::LoadPackedData(this_00,packed_data_00,packed_data_block_count);
  (this->group_state).chimp_state.leading_zeros = 0xff;
  (this->group_state).chimp_state.trailing_zeros = '\0';
  (this->group_state).chimp_state.reference_value = 0;
  (this->group_state).chimp_state.ring_buffer.index = 0;
  (this->group_state).chimp_state.first = true;
  (this->group_state).index = 0;
  ChimpGroupState<unsigned_int>::LoadValues(this_00,value_buffer,count);
  return;
}

Assistant:

void LoadGroup(CHIMP_TYPE *value_buffer) {

		//! FIXME: If we change the order of this to flag -> leading_zero_blocks -> packed_data
		//! We can leave out the leading zero block count as well, because it can be derived from
		//! Extracting all the flags and counting the 3's

		// Load the offset indicating where a groups data starts
		metadata_ptr -= sizeof(uint32_t);
		auto data_byte_offset = Load<uint32_t>(metadata_ptr);
		D_ASSERT(data_byte_offset < segment.GetBlockManager().GetBlockSize());
		//  Only used for point queries
		(void)data_byte_offset;

		// Load how many blocks of leading zero bits we have
		metadata_ptr -= sizeof(uint8_t);
		auto leading_zero_block_count = Load<uint8_t>(metadata_ptr);
		D_ASSERT(leading_zero_block_count <= ChimpPrimitives::CHIMP_SEQUENCE_SIZE / 8);

		// Load the leading zero block count
		metadata_ptr -= 3ULL * leading_zero_block_count;
		const auto leading_zero_block_ptr = metadata_ptr;

		// Figure out how many flags there are
		D_ASSERT(segment_count >= total_value_count);
		auto group_size = MinValue<idx_t>(segment_count - total_value_count, ChimpPrimitives::CHIMP_SEQUENCE_SIZE);
		// Reduce by one, because the first value of a group does not have a flag
		auto flag_count = group_size - 1;
		uint16_t flag_byte_count = AlignValue<uint16_t, 4>(UnsafeNumericCast<uint16_t>(flag_count)) / 4;

		// Load the flags
		metadata_ptr -= flag_byte_count;
		auto flags = metadata_ptr;
		group_state.LoadFlags(flags, flag_count);

		// Load the leading zero blocks
		group_state.LoadLeadingZeros(leading_zero_block_ptr, (uint32_t)leading_zero_block_count * 8);

		// Load packed data blocks
		auto packed_data_block_count = group_state.CalculatePackedDataCount();
		metadata_ptr -= packed_data_block_count * 2;
		if ((uint64_t)metadata_ptr & 1) {
			// Align on a two-byte boundary
			metadata_ptr--;
		}
		group_state.LoadPackedData((uint16_t *)metadata_ptr, packed_data_block_count);

		group_state.Reset();

		// Load all values for the group
		group_state.LoadValues(value_buffer, group_size);
	}